

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal
                 (ZSTD_compressionParameters *cParams,ldmParams_t *ldmParams,int isStatic,
                 ZSTD_paramSwitch_e useRowMatchFinder,size_t buffInSize,size_t buffOutSize,
                 U64 pledgedSrcSize,int useSequenceProducer,size_t maxBlockSize)

{
  ldmParams_t params;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  int in_EDX;
  ldmParams_t *in_RSI;
  undefined4 *in_RDI;
  size_t in_R8;
  size_t in_R9;
  ulong in_stack_00000008;
  int in_stack_00000010;
  size_t in_stack_00000018;
  size_t neededSpace;
  size_t externalSeqSpace;
  size_t maxNbExternalSeq;
  size_t cctxSpace;
  size_t bufferSpace;
  size_t ldmSeqSpace;
  size_t maxNbLdmSeq;
  size_t ldmSpace;
  size_t matchStateSize;
  size_t blockStateSpace;
  size_t entropySpace;
  size_t tokenSpace;
  size_t maxNbSeq;
  size_t blockSize;
  size_t windowSize;
  size_t local_120;
  size_t local_118;
  size_t local_108;
  ulong in_stack_ffffffffffffff18;
  ulong uVar10;
  ulong local_d8;
  undefined8 in_stack_ffffffffffffff70;
  U32 forCCtx;
  undefined8 in_stack_ffffffffffffff78;
  ZSTD_compressionParameters *in_stack_ffffffffffffff80;
  
  forCCtx = (U32)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  if ((ulong)(1L << ((byte)*in_RDI & 0x3f)) < in_stack_00000008) {
    local_d8 = 1L << ((byte)*in_RDI & 0x3f);
  }
  else {
    local_d8 = in_stack_00000008;
  }
  if (local_d8 == 0) {
    in_stack_00000008 = 1;
  }
  else {
    in_stack_ffffffffffffff18 = in_stack_00000008;
    if ((ulong)(1L << ((byte)*in_RDI & 0x3f)) < in_stack_00000008) {
      in_stack_ffffffffffffff18 = 1L << ((byte)*in_RDI & 0x3f);
      in_stack_00000008 = in_stack_ffffffffffffff18;
    }
  }
  uVar10 = in_stack_00000008;
  sVar1 = ZSTD_resolveMaxBlockSize(in_stack_00000018);
  if (sVar1 < in_stack_00000008) {
    in_stack_00000008 = ZSTD_resolveMaxBlockSize(in_stack_00000018);
  }
  sVar1 = in_stack_00000008;
  sVar2 = ZSTD_maxNbSeq(in_stack_00000008,in_RDI[4],in_stack_00000010);
  sVar3 = ZSTD_cwksp_alloc_size(in_stack_00000008 + 0x20);
  sVar4 = ZSTD_cwksp_aligned_alloc_size(0x17c1ed);
  sVar2 = ZSTD_cwksp_alloc_size(sVar2);
  sVar5 = ZSTD_cwksp_alloc_size(0x22d8);
  sVar6 = ZSTD_cwksp_alloc_size(0x1600);
  sVar7 = ZSTD_sizeof_matchState
                    (in_stack_ffffffffffffff80,
                     (ZSTD_paramSwitch_e)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (U32)in_stack_ffffffffffffff78,forCCtx);
  params.bucketSizeLog = (int)in_stack_ffffffffffffff18;
  params.minMatchLength = (int)(in_stack_ffffffffffffff18 >> 0x20);
  params.enableLdm = (int)sVar1;
  params.hashLog = (int)(sVar1 >> 0x20);
  params.hashRateLog = (int)uVar10;
  params.windowLog = (int)(uVar10 >> 0x20);
  sVar1 = ZSTD_ldm_getTableSize(params);
  ZSTD_ldm_getMaxNbSeq(*in_RSI,in_stack_00000008);
  if (in_RSI->enableLdm == ZSTD_ps_enable) {
    local_108 = ZSTD_cwksp_aligned_alloc_size(0x17c344);
  }
  else {
    local_108 = 0;
  }
  sVar8 = ZSTD_cwksp_alloc_size(in_R8);
  sVar9 = ZSTD_cwksp_alloc_size(in_R9);
  if (in_EDX == 0) {
    local_118 = 0;
  }
  else {
    local_118 = ZSTD_cwksp_alloc_size(0x1478);
  }
  ZSTD_sequenceBound(in_stack_00000008);
  if (in_stack_00000010 == 0) {
    local_120 = 0;
  }
  else {
    local_120 = ZSTD_cwksp_aligned_alloc_size(0x17c3ee);
  }
  return local_118 + sVar5 + sVar6 * 2 + sVar1 + local_108 + sVar7 + sVar3 + sVar4 + sVar2 * 3 +
         sVar8 + sVar9 + local_120;
}

Assistant:

static size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal(
        const ZSTD_compressionParameters* cParams,
        const ldmParams_t* ldmParams,
        const int isStatic,
        const ZSTD_paramSwitch_e useRowMatchFinder,
        const size_t buffInSize,
        const size_t buffOutSize,
        const U64 pledgedSrcSize,
        int useSequenceProducer,
        size_t maxBlockSize)
{
    size_t const windowSize = (size_t) BOUNDED(1ULL, 1ULL << cParams->windowLog, pledgedSrcSize);
    size_t const blockSize = MIN(ZSTD_resolveMaxBlockSize(maxBlockSize), windowSize);
    size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, cParams->minMatch, useSequenceProducer);
    size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                            + ZSTD_cwksp_aligned_alloc_size(maxNbSeq * sizeof(seqDef))
                            + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
    size_t const entropySpace = ZSTD_cwksp_alloc_size(ENTROPY_WORKSPACE_SIZE);
    size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
    size_t const matchStateSize = ZSTD_sizeof_matchState(cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 0, /* forCCtx */ 1);

    size_t const ldmSpace = ZSTD_ldm_getTableSize(*ldmParams);
    size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(*ldmParams, blockSize);
    size_t const ldmSeqSpace = ldmParams->enableLdm == ZSTD_ps_enable ?
        ZSTD_cwksp_aligned_alloc_size(maxNbLdmSeq * sizeof(rawSeq)) : 0;


    size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize)
                             + ZSTD_cwksp_alloc_size(buffOutSize);

    size_t const cctxSpace = isStatic ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;

    size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
    size_t const externalSeqSpace = useSequenceProducer
        ? ZSTD_cwksp_aligned_alloc_size(maxNbExternalSeq * sizeof(ZSTD_Sequence))
        : 0;

    size_t const neededSpace =
        cctxSpace +
        entropySpace +
        blockStateSpace +
        ldmSpace +
        ldmSeqSpace +
        matchStateSize +
        tokenSpace +
        bufferSpace +
        externalSeqSpace;

    DEBUGLOG(5, "estimate workspace : %u", (U32)neededSpace);
    return neededSpace;
}